

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

StateRecorderApplicationFeatureHash
Fossilize::Hashing::compute_application_feature_hash(VkApplicationInfo *info,void *device_pnext)

{
  Hash HVar1;
  Hash HVar2;
  StateRecorderApplicationFeatureHash SVar3;
  
  if (info == (VkApplicationInfo *)0x0) {
    HVar1 = 0;
  }
  else {
    HVar1 = compute_hash_application_info(info);
  }
  if (device_pnext == (void *)0x0) {
    HVar2 = 0;
  }
  else {
    HVar2 = compute_hash_physical_device_features(device_pnext);
  }
  SVar3.physical_device_features_hash = HVar2;
  SVar3.application_info_hash = HVar1;
  return SVar3;
}

Assistant:

StateRecorderApplicationFeatureHash compute_application_feature_hash(const VkApplicationInfo *info,
                                                                     const void *device_pnext)
{
	StateRecorderApplicationFeatureHash hash = {};
	if (info)
		hash.application_info_hash = compute_hash_application_info(*info);
	if (device_pnext)
		hash.physical_device_features_hash = compute_hash_physical_device_features(device_pnext);
	return hash;
}